

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O0

void nhdp_db_neighbor_join(nhdp_neighbor *dst,nhdp_neighbor *src)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *__tempptr_11;
  list_entity *__tempptr_10;
  list_entity *__tempptr_9;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_laddr *la_it;
  nhdp_laddr *laddr;
  nhdp_link *l_it;
  nhdp_link *lnk;
  nhdp_naddr *na_it;
  nhdp_naddr *naddr;
  nhdp_neighbor *src_local;
  nhdp_neighbor *dst_local;
  
  if (dst != src) {
    dst->symmetric = src->symmetric + dst->symmetric;
    plVar1 = (src->_links).next;
    l_it = (nhdp_link *)&plVar1[-0x20].prev;
    plVar1 = plVar1->next;
    while (laddr = (nhdp_laddr *)&plVar1[-0x20].prev, (l_it->_neigh_node).prev != (src->_links).prev
          ) {
      plVar2 = (l_it->_addresses).list_head.next;
      la_it = (nhdp_laddr *)(plVar2 + -6);
      plVar2 = plVar2->next;
      while (__tempptr = plVar2 + -6,
            (la_it->_neigh_node).list.prev != (l_it->_addresses).list_head.prev) {
        avl_remove(&src->_link_addresses,&la_it->_neigh_node);
        avl_insert(&dst->_link_addresses,&la_it->_neigh_node);
        la_it = (nhdp_laddr *)__tempptr;
        plVar2 = plVar2->next;
      }
      if ((src->originator)._type != '\0') {
        avl_remove(&l_it->local_if->_link_originators,&l_it->_originator_node);
      }
      (l_it->_originator_node).key = dst;
      if ((dst->originator)._type != '\0') {
        avl_insert(&l_it->local_if->_link_originators,&l_it->_originator_node);
      }
      plVar2 = (l_it->_neigh_node).prev;
      plVar3 = (l_it->_neigh_node).next;
      plVar2->next = plVar3;
      plVar3->prev = plVar2;
      (l_it->_neigh_node).prev = (list_entity *)0x0;
      (l_it->_neigh_node).next = (list_entity *)0x0;
      plVar3 = &l_it->_neigh_node;
      plVar2 = (dst->_links).prev;
      plVar3->next = &dst->_links;
      (l_it->_neigh_node).prev = plVar2;
      (dst->_links).prev = plVar3;
      plVar2->next = plVar3;
      l_it->neigh = dst;
      l_it = (nhdp_link *)laddr;
      plVar1 = plVar1->next;
    }
    plVar1 = (src->_neigh_addresses).list_head.next;
    na_it = (nhdp_naddr *)&plVar1[-9].prev;
    plVar1 = plVar1->next;
    while (lnk = (nhdp_link *)&plVar1[-9].prev,
          (na_it->_neigh_node).list.prev != (src->_neigh_addresses).list_head.prev) {
      avl_remove(&src->_neigh_addresses,&na_it->_neigh_node);
      avl_insert(&dst->_neigh_addresses,&na_it->_neigh_node);
      na_it->neigh = dst;
      na_it = (nhdp_naddr *)lnk;
      plVar1 = plVar1->next;
    }
    nhdp_db_neighbor_remove(src);
  }
  return;
}

Assistant:

void
nhdp_db_neighbor_join(struct nhdp_neighbor *dst, struct nhdp_neighbor *src) {
  struct nhdp_naddr *naddr, *na_it;
  struct nhdp_link *lnk, *l_it;
  struct nhdp_laddr *laddr, *la_it;

  if (dst == src) {
    return;
  }

  /* fix symmetric link count */
  dst->symmetric += src->symmetric;

  /* move links */
  list_for_each_element_safe(&src->_links, lnk, _neigh_node, l_it) {
    /* more addresses to new neighbor */
    avl_for_each_element_safe(&lnk->_addresses, laddr, _neigh_node, la_it) {
      avl_remove(&src->_link_addresses, &laddr->_neigh_node);
      avl_insert(&dst->_link_addresses, &laddr->_neigh_node);
    }

    /* move interface based originator */
    if (netaddr_get_address_family(&src->originator) != AF_UNSPEC) {
      avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }
    lnk->_originator_node.key = &dst->originator;
    if (netaddr_get_address_family(&dst->originator) != AF_UNSPEC) {
      avl_insert(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }

    /* move link to new neighbor */
    list_remove(&lnk->_neigh_node);
    list_add_tail(&dst->_links, &lnk->_neigh_node);
    lnk->neigh = dst;
  }

  /* move neighbor addresses to target */
  avl_for_each_element_safe(&src->_neigh_addresses, naddr, _neigh_node, na_it) {
    /* move address to new neighbor */
    avl_remove(&src->_neigh_addresses, &naddr->_neigh_node);
    avl_insert(&dst->_neigh_addresses, &naddr->_neigh_node);
    naddr->neigh = dst;
  }

  nhdp_db_neighbor_remove(src);
}